

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

void AdjustNurbsCurve(ON_NurbsCurve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  bool bVar1;
  int iVar2;
  uint c;
  ON_3dPoint *point;
  uint i;
  long lVar3;
  ON_3dPointArray Points;
  double local_50;
  ON_SimpleArray<ON_3dPoint> local_48;
  
  iVar2 = (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (iVar2 < 4) {
    ON_NurbsCurve::ClampEnd(crv,2);
    c = ON_NurbsCurve::CVCount(crv);
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_48,c);
    if (0 < (int)c) {
      i = 0;
      do {
        point = ON_SimpleArray<ON_3dPoint>::AppendNew(&local_48);
        ON_NurbsCurve::GetCV(crv,i,point);
        i = i + 1;
      } while (c != i);
    }
    bVar1 = AdjustPointListAlongChord((ON_3dPointArray *)&local_48,P0,P1);
    if (bVar1) {
      bVar1 = ON_NurbsCurve::IsRational(crv);
      if (0 < (int)c) {
        lVar3 = 0;
        iVar2 = 0;
        do {
          local_50 = 1.0;
          if (bVar1) {
            local_50 = ON_NurbsCurve::Weight(crv,iVar2);
            ON_3dPoint::operator*=((ON_3dPoint *)((long)&(local_48.m_a)->x + lVar3),local_50);
          }
          ON_NurbsCurve::SetCV(crv,iVar2,(ON_3dPoint *)((long)&(local_48.m_a)->x + lVar3));
          if (bVar1) {
            ON_NurbsCurve::SetWeight(crv,iVar2,local_50);
          }
          iVar2 = iVar2 + 1;
          lVar3 = lVar3 + 0x18;
        } while ((ulong)c * 0x18 != lVar3);
      }
    }
    else {
      (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(crv);
      (*(crv->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])(crv);
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_48);
  }
  return;
}

Assistant:

static void AdjustNurbsCurve(ON_NurbsCurve& crv,
                             const ON_3dPoint& P0, 
                             const ON_3dPoint& P1)

{
  if (crv.Dimension() > 3)
    return;

  crv.ClampEnd(2);
  int cvc = crv.CVCount();
  ON_3dPointArray Points(cvc);
  int i;
  for (i=0; i<cvc; i++)
    crv.GetCV(i, Points.AppendNew());

  if (!AdjustPointListAlongChord(Points, P0, P1)){
    crv.SetStartPoint(P0);
    crv.SetEndPoint(P1);
    return;
  }

  bool rat = crv.IsRational();
  for (i=0; i<cvc; i++){
    double w = 1.0;
    if (rat){
      w = crv.Weight(i);
      Points[i] *= w;
    }
    crv.SetCV(i, Points[i]);
    if (rat)
      crv.SetWeight(i, w);
  }
  
  return;
}